

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ParameterValueAssignmentSyntax::getChild
          (ParameterValueAssignmentSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  Info *in_stack_ffffffffffffff90;
  nullptr_t in_stack_ffffffffffffff98;
  
  switch(in_RDX) {
  case 0:
    token.info = in_stack_ffffffffffffff90;
    token._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x50db36,token);
    break;
  case 1:
    token_00.info = in_stack_ffffffffffffff90;
    token_00._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x50db66,token_00);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x38),in_stack_ffffffffffffff88);
    break;
  case 3:
    token_01.info = in_stack_ffffffffffffff90;
    token_01._0_8_ = in_stack_ffffffffffffff88;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x50dbcd,token_01);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax ParameterValueAssignmentSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return hash;
        case 1: return openParen;
        case 2: return &parameters;
        case 3: return closeParen;
        default: return nullptr;
    }
}